

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlEncInputChunk(xmlCharEncodingHandler *handler,uchar *out,int *outlen,uchar *in,int *inlen)

{
  xmlCharEncConvFunc conv;
  int ret;
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *out_local;
  xmlCharEncodingHandler *handler_local;
  
  if (handler->input == (xmlCharEncodingInputFunc)0x0) {
    *outlen = 0;
    *inlen = 0;
    conv._4_4_ = -1;
  }
  else {
    conv._4_4_ = (*handler->input)(out,outlen,in,inlen);
    if (0 < conv._4_4_) {
      conv._4_4_ = 0;
    }
  }
  return conv._4_4_;
}

Assistant:

int
xmlEncInputChunk(xmlCharEncodingHandler *handler, unsigned char *out,
                 int *outlen, const unsigned char *in, int *inlen) {
    int ret;

    if (handler->input != NULL) {
        xmlCharEncConvFunc conv =
            (xmlCharEncConvFunc) (void (*)(void)) handler->input;

        ret = conv(out, outlen, in, inlen, handler->inputCtxt);
        if (ret > 0)
            ret = XML_ENC_ERR_SUCCESS;
    }
    else {
        *outlen = 0;
        *inlen = 0;
        ret = XML_ENC_ERR_INTERNAL;
    }

    return(ret);
}